

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O0

uint highbd_masked_sad(uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,
                      int b_stride,uint8_t *m,int m_stride,int width,int height)

{
  int iVar1;
  uint16_t pred;
  uint16_t *b;
  uint16_t *a;
  uint16_t *src;
  uint sad;
  int x;
  int y;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  int src_stride_local;
  uint8_t *src8_local;
  
  sad = 0;
  src = (uint16_t *)((long)src8 << 1);
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      iVar1 = ((int)((uint)m[x] * (uint)a[x] + (0x40 - (uint)m[x]) * (uint)b[x] + 0x20) >> 6 &
              0xffffU) - (uint)src[x];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      sad = iVar1 + sad;
    }
    src = src + src_stride;
    a = a + a_stride;
    b = b + b_stride;
    m = m + m_stride;
  }
  return sad;
}

Assistant:

static inline unsigned int highbd_masked_sad(
                            const uint8_t *src8, int src_stride,
                            const uint8_t *a8, int a_stride, const uint8_t *b8,
                            int b_stride, const uint8_t *m, int m_stride,
                            int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const uint16_t pred = AOM_BLEND_A64(m[x], a[x], b[x]);
      sad += abs(pred - src[x]);
    }

    src += src_stride;
    a += a_stride;
    b += b_stride;
    m += m_stride;
  }

  return sad;
}